

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaWriter::writeMesh(ofstream *out,Mesh *mesh,int id)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  double dVar2;
  _List_node_base *p_Var3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  _List_node_base *p_Var7;
  ostream *poVar8;
  _List_node_base *p_Var9;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar10;
  
  sVar4 = (mesh->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
          _M_impl._M_node._M_size;
  sVar5 = (mesh->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
          _M_node._M_size;
  plVar1 = &(mesh->mesh).vertices;
  p_Var7 = (_List_node_base *)0x0;
  p_Var9 = (_List_node_base *)plVar1;
  while (p_Var9 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var9->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)plVar1) {
    p_Var9[6]._M_next = p_Var7;
    p_Var7 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
  }
  poVar8 = std::operator<<((ostream *)out,"      <geometry id=\"M");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"\" name=\"Mesh");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"\">");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"         <mesh>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"            <source id=\"M");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"-positions\">");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"               <float_array id=\"M");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"-positions-array\" count=\"");
  iVar6 = (int)sVar4;
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6 * 3);
  poVar8 = std::operator<<(poVar8,"\">");
  p_Var9 = (_List_node_base *)plVar1;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar8);
    p_Var9 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var9->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var9 == (_List_node_base *)plVar1) break;
    p_Var7 = p_Var9[1]._M_prev;
    dVar2 = (double)p_Var9[2]._M_next;
    p_Var3 = p_Var9[2]._M_prev;
    std::operator<<((ostream *)out,"                  ");
    poVar8 = std::ostream::_M_insert<double>((double)p_Var7);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar8," ");
    poVar8 = std::ostream::_M_insert<double>((double)p_Var3);
  }
  poVar8 = std::operator<<((ostream *)out,"               </float_array>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"               <technique_common>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"                  <accessor source=\"#M");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"-positions-array\" count=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
  poVar8 = std::operator<<(poVar8,"\" stride=\"3\">");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"                     <param name=\"X\" type=\"float\"/>")
  ;
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"                     <param name=\"Y\" type=\"float\"/>")
  ;
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"                     <param name=\"Z\" type=\"float\"/>")
  ;
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"                  </accessor>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"               </technique_common>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"            </source>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"            <vertices id=\"M");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"-vertices\">");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"               <input semantic=\"POSITION\" source=\"#M")
  ;
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"-positions\"/>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"            </vertices>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"         <polylist count=\"");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)sVar5);
  poVar8 = std::operator<<(poVar8,"\">");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"            <input semantic=\"VERTEX\" source=\"#M");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,id);
  poVar8 = std::operator<<(poVar8,"-vertices\" offset=\"0\"/>");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::operator<<((ostream *)out,"            <vcount>");
  plVar10 = &(mesh->mesh).faces;
  p_Var9 = (_List_node_base *)plVar10;
  while (p_Var9 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var9->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)plVar10) {
    Face::degree((Face *)(p_Var9 + 1));
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar8," ");
  }
  poVar8 = std::operator<<((ostream *)out,"            </vcount>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"            <p>");
  p_Var9 = (_List_node_base *)plVar10;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar8);
    p_Var9 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var9->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    if (p_Var9 == (_List_node_base *)plVar10) break;
    std::operator<<((ostream *)out,"               ");
    p_Var7 = p_Var9[0xb]._M_prev;
    do {
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::operator<<(poVar8," ");
      p_Var7 = p_Var7[2]._M_next;
      poVar8 = (ostream *)out;
    } while (p_Var9[0xb]._M_prev != p_Var7);
  }
  poVar8 = std::operator<<((ostream *)out,"            </p>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"         </polylist>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"         </mesh>");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)out,"      </geometry>");
  std::endl<char,std::char_traits<char>>(poVar8);
  return;
}

Assistant:

void ColladaWriter::writeMesh( ofstream& out, DynamicScene::Mesh* mesh, int id )
{
   HalfedgeMesh& m( mesh->mesh );
   int nV = m.nVertices();
   int nF = m.nFaces();

   // TODO transformations are currently ignored

   // assign a unique ID to each vertex (we will need these so that
   // each polygon can reference its vertices)
   int index = 0;
   for( VertexIter v = m.verticesBegin(); v != m.verticesEnd(); v++ )
   {
      v->index = index;
      index++;
   }

   out << "      <geometry id=\"M" << id << "\" name=\"Mesh" << id << "\">" << endl;
   out << "         <mesh>" << endl;

   // positions -------------
   out << "            <source id=\"M" << id << "-positions\">" << endl;
   out << "               <float_array id=\"M" << id << "-positions-array\" count=\"" << 3*nV << "\">" << endl;
   for( VertexIter v = m.verticesBegin(); v != m.verticesEnd(); v++ )
   {
      Vector3D p = v->position;
      out << "                  ";
      out << p.x << " " << p.y << " " << p.z << endl;
   }
   out << "               </float_array>" << endl;
   out << "               <technique_common>" << endl;
   out << "                  <accessor source=\"#M" << id << "-positions-array\" count=\"" << nV << "\" stride=\"3\">" << endl;
   out << "                     <param name=\"X\" type=\"float\"/>" << endl;
   out << "                     <param name=\"Y\" type=\"float\"/>" << endl;
   out << "                     <param name=\"Z\" type=\"float\"/>" << endl;
   out << "                  </accessor>" << endl;
   out << "               </technique_common>" << endl;
   out << "            </source>" << endl;
   
   // vertices -------------
   out << "            <vertices id=\"M" << id << "-vertices\">" << endl;
   out << "               <input semantic=\"POSITION\" source=\"#M" << id << "-positions\"/>" << endl;
   out << "            </vertices>" << endl;
   
   // polygons -------------
   out << "         <polylist count=\"" << nF << "\">" << endl;
   out << "            <input semantic=\"VERTEX\" source=\"#M" << id << "-vertices\" offset=\"0\"/>" << endl;
   out << "            <vcount>";
   for( FaceIter f = m.facesBegin(); f != m.facesEnd(); f++ )
   {
      out << f->degree() << " ";
   }
   out << "            </vcount>" << endl;
   out << "            <p>" << endl;
   for( FaceIter f = m.facesBegin(); f != m.facesEnd(); f++ )
   {
      out << "               ";
      HalfedgeIter h = f->halfedge();
      do
      {
         out << h->vertex()->index << " ";
         h = h->next();
      }
      while( h != f->halfedge() );
      out << endl;
   }
   out << "            </p>" << endl;
   out << "         </polylist>" << endl;

   out << "         </mesh>" << endl;
   out << "      </geometry>" << endl;
}